

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

void ImGui::PopColumnsBackground(void)

{
  ImRect *pIVar1;
  ImVec4 *pIVar2;
  ImGuiWindow *pIVar3;
  ImGuiOldColumns *pIVar4;
  ImDrawList *pIVar5;
  ImVec2 IVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  pIVar3 = GImGui->CurrentWindow;
  pIVar4 = (pIVar3->DC).CurrentColumns;
  if (pIVar4->Count == 1) {
    return;
  }
  pIVar1 = &pIVar4->HostBackupClipRect;
  fVar11 = (pIVar1->Min).x;
  fVar12 = (pIVar1->Min).y;
  fVar13 = (pIVar4->HostBackupClipRect).Max.x;
  fVar14 = (pIVar4->HostBackupClipRect).Max.y;
  fVar7 = (pIVar1->Min).x;
  fVar8 = (pIVar1->Min).y;
  fVar9 = (pIVar4->HostBackupClipRect).Max.x;
  fVar10 = (pIVar4->HostBackupClipRect).Max.y;
  IVar6 = (pIVar4->HostBackupClipRect).Max;
  (pIVar3->ClipRect).Min = (pIVar4->HostBackupClipRect).Min;
  (pIVar3->ClipRect).Max = IVar6;
  pIVar5 = pIVar3->DrawList;
  (pIVar5->_CmdHeader).ClipRect.x = fVar7;
  (pIVar5->_CmdHeader).ClipRect.y = fVar8;
  (pIVar5->_CmdHeader).ClipRect.z = fVar9;
  (pIVar5->_CmdHeader).ClipRect.w = fVar10;
  pIVar2 = (pIVar3->DrawList->_ClipRectStack).Data +
           (long)(pIVar3->DrawList->_ClipRectStack).Size + -1;
  pIVar2->x = fVar11;
  pIVar2->y = fVar12;
  pIVar2->z = fVar13;
  pIVar2->w = fVar14;
  ImDrawListSplitter::SetCurrentChannel(&pIVar4->Splitter,pIVar3->DrawList,pIVar4->Current + 1);
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindowRead()      { ImGuiContext& g = *GImGui; return g.CurrentWindow; }